

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createdfd.c
# Opt level: O2

uint32_t * createDFDDepthStencil(int depthBits,int stencilBits,int sizeBytes)

{
  uint32_t *DFD;
  int sampleNo;
  
  DFD = writeHeader((uint)(0 < stencilBits) + (uint)(0 < depthBits),sizeBytes,0,i_NON_COLOR);
  if (stencilBits == 8 && depthBits == 0x18) {
    DFD[7] = 0xd070000;
    DFD[8] = 0;
    DFD[9] = 0;
    DFD[10] = 1;
    DFD[0xb] = 0xe170008;
    DFD[0xc] = 0;
    DFD[0xd] = 0;
    DFD[0xe] = 0xffffff;
    return DFD;
  }
  if (depthBits == 0x20) {
    DFD[7] = 0xce1f0000;
    DFD[8] = 0;
    DFD[9] = 0xbf800000;
    DFD[10] = 0x3f800000;
  }
  else {
    if (depthBits < 1) {
      if (stencilBits < 1) {
        return DFD;
      }
      sampleNo = 0;
      depthBits = 0;
      goto LAB_001e79b2;
    }
    writeSample(DFD,0,0xe,depthBits,0,1,1,s_UNORM);
  }
  if (stencilBits < 1) {
    return DFD;
  }
  sampleNo = 1;
LAB_001e79b2:
  writeSample(DFD,sampleNo,0xd,stencilBits,depthBits,1,1,s_UINT);
  return DFD;
}

Assistant:

uint32_t *createDFDDepthStencil(int depthBits,
                                int stencilBits,
                                int sizeBytes)
{
    /* N.B. Little-endian is assumed. */
    uint32_t *DFD = 0;
    DFD = writeHeader((depthBits > 0) + (stencilBits > 0),
                      sizeBytes, s_UNORM, i_NON_COLOR);

    /* Handle the special case of D24_UNORM_S8_UINT where the order of the
       channels is flipped by putting stencil in the LSBs. */
    if (depthBits == 24 && stencilBits == 8) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                    8, 0,
                    1, 1, s_UINT);
        writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    24, 8,
                    1, 1, s_UNORM);
        return DFD;
    }

    if (depthBits == 32) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    32, 0,
                    1, 1, s_SFLOAT);
    } else if (depthBits > 0) {
        writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_DEPTH,
                    depthBits, 0,
                    1, 1, s_UNORM);
    }
    if (stencilBits > 0) {
        if (depthBits > 0) {
            writeSample(DFD, 1, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, depthBits,
                        1, 1, s_UINT);
        } else {
            writeSample(DFD, 0, KHR_DF_CHANNEL_RGBSDA_STENCIL,
                        stencilBits, 0,
                        1, 1, s_UINT);
        }
    }
    return DFD;
}